

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void __thiscall QSslSocket::setSslConfiguration(QSslSocket *this,QSslConfiguration *configuration)

{
  long lVar1;
  QArrayData *pQVar2;
  QByteArray *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  bool bVar6;
  int iVar7;
  PeerVerifyMode PVar8;
  SslProtocol SVar9;
  NextProtocolNegotiationStatus NVar10;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  moved;
  QArrayDataPointer<QByteArray> local_60;
  QArrayDataPointer<QByteArray> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  QSslConfiguration::localCertificateChain((QList<QSslCertificate> *)&local_60,configuration);
  qVar4 = local_60.size;
  pQVar3 = local_60.ptr;
  pDVar5 = local_60.d;
  local_60.d = (Data *)0x0;
  local_60.ptr = (QByteArray *)0x0;
  local_60.size = 0;
  local_48.d = *(Data **)(lVar1 + 0x2c0);
  local_48.ptr = *(QByteArray **)(lVar1 + 0x2c8);
  *(Data **)(lVar1 + 0x2c0) = pDVar5;
  *(QByteArray **)(lVar1 + 0x2c8) = pQVar3;
  local_48.size = *(qsizetype *)(lVar1 + 0x2d0);
  *(qsizetype *)(lVar1 + 0x2d0) = qVar4;
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer
            ((QArrayDataPointer<QSslCertificate> *)&local_48);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer
            ((QArrayDataPointer<QSslCertificate> *)&local_60);
  QSslConfiguration::privateKey((QSslConfiguration *)&local_48);
  QSslKey::operator=((QSslKey *)(lVar1 + 0x2d8),(QSslKey *)&local_48);
  QSslKey::~QSslKey((QSslKey *)&local_48);
  QSslConfiguration::ciphers((QList<QSslCipher> *)&local_60,configuration);
  qVar4 = local_60.size;
  pQVar3 = local_60.ptr;
  pDVar5 = local_60.d;
  local_60.d = (Data *)0x0;
  local_60.ptr = (QByteArray *)0x0;
  local_60.size = 0;
  local_48.d = *(Data **)(lVar1 + 0x2f0);
  local_48.ptr = *(QByteArray **)(lVar1 + 0x2f8);
  *(Data **)(lVar1 + 0x2f0) = pDVar5;
  *(QByteArray **)(lVar1 + 0x2f8) = pQVar3;
  local_48.size = *(qsizetype *)(lVar1 + 0x300);
  *(qsizetype *)(lVar1 + 0x300) = qVar4;
  QArrayDataPointer<QSslCipher>::~QArrayDataPointer((QArrayDataPointer<QSslCipher> *)&local_48);
  QArrayDataPointer<QSslCipher>::~QArrayDataPointer((QArrayDataPointer<QSslCipher> *)&local_60);
  QSslConfiguration::ellipticCurves((QList<QSslEllipticCurve> *)&local_48,configuration);
  QArrayDataPointer<QSslEllipticCurve>::operator=
            ((QArrayDataPointer<QSslEllipticCurve> *)(lVar1 + 0x338),
             (QArrayDataPointer<QSslEllipticCurve> *)&local_48);
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,4,0x10);
    }
  }
  QSslConfiguration::preSharedKeyIdentityHint((QByteArray *)&local_48,configuration);
  pQVar2 = *(QArrayData **)(lVar1 + 0x388);
  pQVar3 = *(QByteArray **)(lVar1 + 0x390);
  *(Data **)(lVar1 + 0x388) = local_48.d;
  *(QByteArray **)(lVar1 + 0x390) = local_48.ptr;
  qVar4 = *(qsizetype *)(lVar1 + 0x398);
  *(qsizetype *)(lVar1 + 0x398) = local_48.size;
  local_48.d = (Data *)pQVar2;
  local_48.ptr = pQVar3;
  local_48.size = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,1,0x10);
    }
  }
  QSslConfiguration::diffieHellmanParameters((QSslConfiguration *)&local_48);
  pDVar5 = *(Data **)(lVar1 + 0x350);
  *(Data **)(lVar1 + 0x350) = local_48.d;
  local_48.d = pDVar5;
  QSslDiffieHellmanParameters::~QSslDiffieHellmanParameters
            ((QSslDiffieHellmanParameters *)&local_48);
  QSslConfiguration::caCertificates((QList<QSslCertificate> *)&local_60,configuration);
  qVar4 = local_60.size;
  pQVar3 = local_60.ptr;
  pDVar5 = local_60.d;
  local_60.d = (Data *)0x0;
  local_60.ptr = (QByteArray *)0x0;
  local_60.size = 0;
  local_48.d = *(Data **)(lVar1 + 0x308);
  local_48.ptr = *(QByteArray **)(lVar1 + 0x310);
  *(Data **)(lVar1 + 0x308) = pDVar5;
  *(QByteArray **)(lVar1 + 0x310) = pQVar3;
  local_48.size = *(qsizetype *)(lVar1 + 0x318);
  *(qsizetype *)(lVar1 + 0x318) = qVar4;
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer
            ((QArrayDataPointer<QSslCertificate> *)&local_48);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer
            ((QArrayDataPointer<QSslCertificate> *)&local_60);
  iVar7 = QSslConfiguration::peerVerifyDepth(configuration);
  *(int *)(lVar1 + 0x328) = iVar7;
  PVar8 = QSslConfiguration::peerVerifyMode(configuration);
  *(PeerVerifyMode *)(lVar1 + 0x324) = PVar8;
  SVar9 = QSslConfiguration::protocol(configuration);
  *(SslProtocol *)(lVar1 + 800) = SVar9;
  QSslConfiguration::backendConfiguration(configuration);
  pDVar5 = local_60.d;
  local_60.d = (Data *)0x0;
  local_48.d = *(Data **)(lVar1 + 0x358);
  *(Data **)(lVar1 + 0x358) = pDVar5;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
              *)&local_48);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
              *)&local_60);
  *(Int *)(lVar1 + 0x330) =
       (((configuration->d).d.ptr)->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
       super_QFlagsStorage<QSsl::SslOption>.i;
  QSslConfiguration::sessionTicket((QByteArray *)&local_48,configuration);
  pQVar2 = *(QArrayData **)(lVar1 + 0x360);
  pQVar3 = *(QByteArray **)(lVar1 + 0x368);
  *(Data **)(lVar1 + 0x360) = local_48.d;
  *(QByteArray **)(lVar1 + 0x368) = local_48.ptr;
  qVar4 = *(qsizetype *)(lVar1 + 0x370);
  *(qsizetype *)(lVar1 + 0x370) = local_48.size;
  local_48.d = (Data *)pQVar2;
  local_48.ptr = pQVar3;
  local_48.size = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,1,0x10);
    }
  }
  iVar7 = QSslConfiguration::sessionTicketLifeTimeHint(configuration);
  *(int *)(lVar1 + 0x378) = iVar7;
  QSslConfiguration::allowedNextProtocols((QList<QByteArray> *)&local_60,configuration);
  qVar4 = local_60.size;
  pQVar3 = local_60.ptr;
  pDVar5 = local_60.d;
  local_60.d = (Data *)0x0;
  local_60.ptr = (QByteArray *)0x0;
  local_60.size = 0;
  local_48.d = *(Data **)(lVar1 + 0x3a0);
  local_48.ptr = *(QByteArray **)(lVar1 + 0x3a8);
  *(Data **)(lVar1 + 0x3a0) = pDVar5;
  *(QByteArray **)(lVar1 + 0x3a8) = pQVar3;
  local_48.size = *(qsizetype *)(lVar1 + 0x3b0);
  *(qsizetype *)(lVar1 + 0x3b0) = qVar4;
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_60);
  QSslConfiguration::nextNegotiatedProtocol((QByteArray *)&local_48,configuration);
  pQVar2 = *(QArrayData **)(lVar1 + 0x3b8);
  pQVar3 = *(QByteArray **)(lVar1 + 0x3c0);
  *(Data **)(lVar1 + 0x3b8) = local_48.d;
  *(QByteArray **)(lVar1 + 0x3c0) = local_48.ptr;
  qVar4 = *(qsizetype *)(lVar1 + 0x3c8);
  *(qsizetype *)(lVar1 + 0x3c8) = local_48.size;
  local_48.d = (Data *)pQVar2;
  local_48.ptr = pQVar3;
  local_48.size = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,1,0x10);
    }
  }
  NVar10 = QSslConfiguration::nextProtocolNegotiationStatus(configuration);
  *(NextProtocolNegotiationStatus *)(lVar1 + 0x3d0) = NVar10;
  bVar6 = QSslConfiguration::ocspStaplingEnabled(configuration);
  *(bool *)(lVar1 + 0x3d5) = bVar6;
  bVar6 = QSslConfiguration::handshakeMustInterruptOnError(configuration);
  *(bool *)(lVar1 + 0x3d6) = bVar6;
  bVar6 = QSslConfiguration::missingCertificateIsFatal(configuration);
  *(bool *)(lVar1 + 0x3d7) = bVar6;
  if (((configuration->d).d.ptr)->allowRootCertOnDemandLoading == false) {
    *(undefined1 *)(lVar1 + 0x3f0) = 0;
    *(undefined1 *)(lVar1 + 0x32c) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setSslConfiguration(const QSslConfiguration &configuration)
{
    Q_D(QSslSocket);
    d->configuration.localCertificateChain = configuration.localCertificateChain();
    d->configuration.privateKey = configuration.privateKey();
    d->configuration.ciphers = configuration.ciphers();
    d->configuration.ellipticCurves = configuration.ellipticCurves();
    d->configuration.preSharedKeyIdentityHint = configuration.preSharedKeyIdentityHint();
    d->configuration.dhParams = configuration.diffieHellmanParameters();
    d->configuration.caCertificates = configuration.caCertificates();
    d->configuration.peerVerifyDepth = configuration.peerVerifyDepth();
    d->configuration.peerVerifyMode = configuration.peerVerifyMode();
    d->configuration.protocol = configuration.protocol();
    d->configuration.backendConfig = configuration.backendConfiguration();
    d->configuration.sslOptions = configuration.d->sslOptions;
    d->configuration.sslSession = configuration.sessionTicket();
    d->configuration.sslSessionTicketLifeTimeHint = configuration.sessionTicketLifeTimeHint();
    d->configuration.nextAllowedProtocols = configuration.allowedNextProtocols();
    d->configuration.nextNegotiatedProtocol = configuration.nextNegotiatedProtocol();
    d->configuration.nextProtocolNegotiationStatus = configuration.nextProtocolNegotiationStatus();
#if QT_CONFIG(ocsp)
    d->configuration.ocspStaplingEnabled = configuration.ocspStaplingEnabled();
#endif
#if QT_CONFIG(openssl)
    d->configuration.reportFromCallback = configuration.handshakeMustInterruptOnError();
    d->configuration.missingCertIsFatal = configuration.missingCertificateIsFatal();
#endif // openssl
    // if the CA certificates were set explicitly (either via
    // QSslConfiguration::setCaCertificates() or QSslSocket::setCaCertificates(),
    // we cannot load the certificates on demand
    if (!configuration.d->allowRootCertOnDemandLoading) {
        d->allowRootCertOnDemandLoading = false;
        d->configuration.allowRootCertOnDemandLoading = false;
    }
}